

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getMultiIndex<(TasGrid::RuleLocal::erule)3>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          double *x)

{
  pointer piVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  allocator_type local_19;
  
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,&local_19);
  if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        dVar7 = 1.0;
        if (uVar4 != 0) {
          iVar5 = 1;
          uVar6 = uVar4 + 1;
          do {
            iVar5 = iVar5 * 2;
            bVar2 = 3 < uVar6;
            uVar6 = uVar6 >> 1;
          } while (bVar2);
          dVar7 = (double)iVar5;
        }
        uVar6 = uVar4 + 1;
      } while (1e-12 < ABS(((double)(int)(uVar4 * 2 + 3) / dVar7 + -3.0) - x[lVar3]));
      piVar1[lVar3] = uVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_BaseCanonicalGrid).num_dimensions);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GridLocalPolynomial::getMultiIndex(const double x[]){
    std::vector<int> p(num_dimensions); // convert x to p, maybe expensive
    for(int j=0; j<num_dimensions; j++){
        int i = 0;
        while(std::abs(RuleLocal::getNode<effrule>(i) - x[j]) > Maths::num_tol) i++;
        p[j] = i;
    }
    return p;
}